

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::draw_elements_instanced_incomplete_primitive
               (NegativeTestContext *ctx)

{
  undefined *puVar1;
  NegativeTestContext *pNVar2;
  bool bVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  mapped_type *this;
  ContextInfo *this_00;
  char *local_3e8;
  char *local_3d8;
  char *tfVarying;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  StringTemplate local_2e0;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  StringTemplate local_278;
  string local_258;
  ProgramSources local_238;
  undefined1 local_168 [8];
  ShaderProgram program;
  key_type local_90;
  undefined1 local_60 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  GLuint local_28;
  GLfloat vertices [1];
  GLuint tfID;
  GLuint buf;
  GLuint fbo;
  byte local_11;
  NegativeTestContext *pNStack_10;
  bool isES32;
  NegativeTestContext *ctx_local;
  
  pNStack_10 = ctx;
  pRVar5 = NegativeTestContext::getRenderContext(ctx);
  fbo = (*pRVar5->_vptr_RenderContext[2])();
  buf = (GLuint)glu::ApiType::es(3,2);
  local_11 = glu::contextSupports((ContextType)fbo,(ApiType)buf);
  tfID = 0;
  vertices[0] = 0.0;
  local_28 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_60);
  if ((local_11 & 1) == 0) {
    local_3e8 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  }
  else {
    local_3e8 = glu::getGLSLVersionDeclaration(GLSL_VERSION_320_ES);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"GLSL_VERSION_STRING",
             (allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_60,&local_90);
  std::__cxx11::string::operator=((string *)this,local_3e8);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
  pRVar5 = NegativeTestContext::getRenderContext(pNStack_10);
  puVar1 = vertexShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,puVar1,&local_299);
  tcu::StringTemplate::StringTemplate(&local_278,&local_298);
  tcu::StringTemplate::specialize
            (&local_258,&local_278,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_60);
  puVar1 = fragmentShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,puVar1,&local_301);
  tcu::StringTemplate::StringTemplate(&local_2e0,&local_300);
  tcu::StringTemplate::specialize
            (&local_2c0,&local_2e0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_60);
  glu::makeVtxFragSources(&local_238,&local_258,&local_2c0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_168,pRVar5,&local_238);
  glu::ProgramSources::~ProgramSources(&local_238);
  std::__cxx11::string::~string((string *)&local_2c0);
  tcu::StringTemplate::~StringTemplate(&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  std::__cxx11::string::~string((string *)&local_258);
  tcu::StringTemplate::~StringTemplate(&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  pNVar2 = pNStack_10;
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_168);
  glu::CallLogWrapper::glUseProgram(&pNVar2->super_CallLogWrapper,dVar4);
  glu::CallLogWrapper::glVertexAttribDivisor(&pNStack_10->super_CallLogWrapper,0,1);
  NegativeTestContext::expectError(pNStack_10,0);
  pNVar2 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"GL_INVALID_ENUM is generated if mode is not an accepted value.",
             &local_329);
  NegativeTestContext::beginSection(pNVar2,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  glu::CallLogWrapper::glDrawElementsInstanced
            (&pNStack_10->super_CallLogWrapper,0xffffffff,1,0x1401,
             (void *)((long)&args._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),1);
  NegativeTestContext::expectError(pNStack_10,0x500);
  NegativeTestContext::endSection(pNStack_10);
  pNVar2 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,
             "GL_INVALID_ENUM is generated if type is not one of the accepted values.",&local_351);
  NegativeTestContext::beginSection(pNVar2,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  glu::CallLogWrapper::glDrawElementsInstanced
            (&pNStack_10->super_CallLogWrapper,4,1,0xffffffff,
             (void *)((long)&args._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),1);
  NegativeTestContext::expectError(pNStack_10,0x500);
  glu::CallLogWrapper::glDrawElementsInstanced
            (&pNStack_10->super_CallLogWrapper,4,1,0x1406,
             (void *)((long)&args._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),1);
  NegativeTestContext::expectError(pNStack_10,0x500);
  NegativeTestContext::endSection(pNStack_10);
  pNVar2 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,
             "GL_INVALID_VALUE is generated if count or primcount are negative.",&local_379);
  NegativeTestContext::beginSection(pNVar2,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  glu::CallLogWrapper::glDrawElementsInstanced
            (&pNStack_10->super_CallLogWrapper,4,-1,0x1401,
             (void *)((long)&args._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),1);
  NegativeTestContext::expectError(pNStack_10,0x501);
  glu::CallLogWrapper::glDrawElementsInstanced
            (&pNStack_10->super_CallLogWrapper,4,0xb,0x1401,
             (void *)((long)&args._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),-1);
  NegativeTestContext::expectError(pNStack_10,0x501);
  NegativeTestContext::endSection(pNStack_10);
  pNVar2 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,
             "GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete."
             ,&local_3a1);
  NegativeTestContext::beginSection(pNVar2,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  glu::CallLogWrapper::glGenFramebuffers(&pNStack_10->super_CallLogWrapper,1,&tfID);
  glu::CallLogWrapper::glBindFramebuffer(&pNStack_10->super_CallLogWrapper,0x8d40,tfID);
  glu::CallLogWrapper::glCheckFramebufferStatus(&pNStack_10->super_CallLogWrapper,0x8d40);
  glu::CallLogWrapper::glDrawElementsInstanced
            (&pNStack_10->super_CallLogWrapper,4,1,0x1401,
             (void *)((long)&args._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),1);
  NegativeTestContext::expectError(pNStack_10,0x506);
  glu::CallLogWrapper::glBindFramebuffer(&pNStack_10->super_CallLogWrapper,0x8d40,0);
  glu::CallLogWrapper::glDeleteFramebuffers(&pNStack_10->super_CallLogWrapper,1,&tfID);
  NegativeTestContext::endSection(pNStack_10);
  this_00 = NegativeTestContext::getContextInfo(pNStack_10);
  bVar3 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_geometry_shader");
  pNVar2 = pNStack_10;
  if (!bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c8,
               "GL_INVALID_OPERATION is generated if transform feedback is active and not paused.",
               (allocator<char> *)((long)&tfVarying + 7));
    NegativeTestContext::beginSection(pNVar2,&local_3c8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&tfVarying + 7));
    local_3d8 = "gl_Position";
    glu::CallLogWrapper::glGenBuffers(&pNStack_10->super_CallLogWrapper,1,(GLuint *)vertices);
    glu::CallLogWrapper::glGenTransformFeedbacks(&pNStack_10->super_CallLogWrapper,1,&local_28);
    pNVar2 = pNStack_10;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_168);
    glu::CallLogWrapper::glUseProgram(&pNVar2->super_CallLogWrapper,dVar4);
    pNVar2 = pNStack_10;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_168);
    glu::CallLogWrapper::glTransformFeedbackVaryings
              (&pNVar2->super_CallLogWrapper,dVar4,1,&local_3d8,0x8c8c);
    pNVar2 = pNStack_10;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_168);
    glu::CallLogWrapper::glLinkProgram(&pNVar2->super_CallLogWrapper,dVar4);
    glu::CallLogWrapper::glBindTransformFeedback(&pNStack_10->super_CallLogWrapper,0x8e22,local_28);
    glu::CallLogWrapper::glBindBuffer(&pNStack_10->super_CallLogWrapper,0x8c8e,(GLuint)vertices[0]);
    glu::CallLogWrapper::glBufferData
              (&pNStack_10->super_CallLogWrapper,0x8c8e,0x20,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBufferBase
              (&pNStack_10->super_CallLogWrapper,0x8c8e,0,(GLuint)vertices[0]);
    glu::CallLogWrapper::glBeginTransformFeedback(&pNStack_10->super_CallLogWrapper,4);
    NegativeTestContext::expectError(pNStack_10,0);
    glu::CallLogWrapper::glDrawElementsInstanced
              (&pNStack_10->super_CallLogWrapper,4,1,0x1401,
               (void *)((long)&args._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),1);
    NegativeTestContext::expectError(pNStack_10,0x502);
    glu::CallLogWrapper::glPauseTransformFeedback(&pNStack_10->super_CallLogWrapper);
    glu::CallLogWrapper::glDrawElementsInstanced
              (&pNStack_10->super_CallLogWrapper,4,1,0x1401,
               (void *)((long)&args._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),1);
    NegativeTestContext::expectError(pNStack_10,0);
    glu::CallLogWrapper::glEndTransformFeedback(&pNStack_10->super_CallLogWrapper);
    glu::CallLogWrapper::glDeleteBuffers(&pNStack_10->super_CallLogWrapper,1,(GLuint *)vertices);
    glu::CallLogWrapper::glDeleteTransformFeedbacks(&pNStack_10->super_CallLogWrapper,1,&local_28);
    NegativeTestContext::expectError(pNStack_10,0);
    NegativeTestContext::endSection(pNStack_10);
  }
  glu::CallLogWrapper::glUseProgram(&pNStack_10->super_CallLogWrapper,0);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_168);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_60);
  return;
}

Assistant:

void draw_elements_instanced_incomplete_primitive (NegativeTestContext& ctx)
{
	const bool					isES32	= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	GLuint						fbo		= 0;
	GLuint						buf		= 0;
	GLuint						tfID	= 0;
	GLfloat						vertices[1];
	map<string, string>			args;
	args["GLSL_VERSION_STRING"]			= isES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);
	glu::ShaderProgram			program	(ctx.getRenderContext(), glu::makeVtxFragSources(tcu::StringTemplate(vertexShaderSource).specialize(args), tcu::StringTemplate(fragmentShaderSource).specialize(args)));

	ctx.glUseProgram(program.getProgram());
	ctx.glVertexAttribDivisor(0, 1);
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_ENUM is generated if mode is not an accepted value.");
	ctx.glDrawElementsInstanced(-1, 1, GL_UNSIGNED_BYTE, vertices, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if type is not one of the accepted values.");
	ctx.glDrawElementsInstanced(GL_TRIANGLES, 1, -1, vertices, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glDrawElementsInstanced(GL_TRIANGLES, 1, GL_FLOAT, vertices, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if count or primcount are negative.");
	ctx.glDrawElementsInstanced(GL_TRIANGLES, -1, GL_UNSIGNED_BYTE, vertices, 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glDrawElementsInstanced(GL_TRIANGLES, 11, GL_UNSIGNED_BYTE, vertices, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete.");
	ctx.glGenFramebuffers(1, &fbo);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
	ctx.glCheckFramebufferStatus(GL_FRAMEBUFFER);
	ctx.glDrawElementsInstanced(GL_TRIANGLES, 1, GL_UNSIGNED_BYTE, vertices, 1);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, 0);
	ctx.glDeleteFramebuffers(1, &fbo);
	ctx.endSection();

	if (!ctx.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader")) // GL_EXT_geometry_shader removes error
	{
		ctx.beginSection("GL_INVALID_OPERATION is generated if transform feedback is active and not paused.");
		const char* tfVarying= "gl_Position";

		ctx.glGenBuffers(1, &buf);
		ctx.glGenTransformFeedbacks(1, &tfID);

		ctx.glUseProgram(program.getProgram());
		ctx.glTransformFeedbackVaryings(program.getProgram(), 1, &tfVarying, GL_INTERLEAVED_ATTRIBS);
		ctx.glLinkProgram(program.getProgram());
		ctx.glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, tfID);
		ctx.glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, buf);
		ctx.glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 32, DE_NULL, GL_DYNAMIC_DRAW);
		ctx.glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, buf);
		ctx.glBeginTransformFeedback(GL_TRIANGLES);
		ctx.expectError(GL_NO_ERROR);

		ctx.glDrawElementsInstanced(GL_TRIANGLES, 1, GL_UNSIGNED_BYTE, vertices, 1);
		ctx.expectError(GL_INVALID_OPERATION);

		ctx.glPauseTransformFeedback();
		ctx.glDrawElementsInstanced	(GL_TRIANGLES, 1, GL_UNSIGNED_BYTE, vertices, 1);
		ctx.expectError(GL_NO_ERROR);

		ctx.glEndTransformFeedback();
		ctx.glDeleteBuffers(1, &buf);
		ctx.glDeleteTransformFeedbacks(1, &tfID);
		ctx.expectError(GL_NO_ERROR);
		ctx.endSection();
	}

	ctx.glUseProgram(0);
}